

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_array.h
# Opt level: O0

bool __thiscall
gim_array<GIM_RSORT_TOKEN>::resizeData(gim_array<GIM_RSORT_TOKEN> *this,uint newsize)

{
  GIM_RSORT_TOKEN *pGVar1;
  uint in_ESI;
  gim_array<GIM_RSORT_TOKEN> *in_RDI;
  void *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (in_ESI == 0) {
    destroyData(in_RDI);
  }
  else {
    if (in_RDI->m_size == 0) {
      pGVar1 = (GIM_RSORT_TOKEN *)gim_alloc((size_t)in_RDI);
      in_RDI->m_data = pGVar1;
    }
    else {
      pGVar1 = (GIM_RSORT_TOKEN *)
               gim_realloc(unaff_retaddr,
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                           (size_t)in_RDI);
      in_RDI->m_data = pGVar1;
    }
    in_RDI->m_allocated_size = in_ESI;
  }
  return true;
}

Assistant:

inline bool resizeData(GUINT newsize)
	{
		if(newsize==0)
		{
			destroyData();
			return true;
		}

		if(m_size>0)
		{
            m_data = (T*)gim_realloc(m_data,m_size*sizeof(T),newsize*sizeof(T));
		}
		else
		{
		    m_data = (T*)gim_alloc(newsize*sizeof(T));
		}
		m_allocated_size = newsize;
		return true;
	}